

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool_p.h
# Opt level: O3

void __thiscall QThreadPoolPrivate::~QThreadPoolPrivate(QThreadPoolPrivate *this)

{
  Data *pDVar1;
  Data *pDVar2;
  Data *pDVar3;
  
  (this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QThreadPoolPrivate_0069e558;
  pDVar1 = (this->objectName).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->objectName).d.d)->super_QArrayData,2,0x10);
    }
  }
  QWaitCondition::~QWaitCondition(&this->noActiveThreads);
  pDVar2 = (this->queue).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->queue).d.d)->super_QArrayData,8,0x10);
    }
  }
  pDVar3 = (this->expiredThreads).super_QList<QThreadPoolThread_*>.d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> +
         -1);
    UNLOCK();
    if ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0)
    {
      QArrayData::deallocate
                (&((this->expiredThreads).super_QList<QThreadPoolThread_*>.d.d)->super_QArrayData,8,
                 0x10);
    }
  }
  pDVar3 = (this->waitingThreads).super_QList<QThreadPoolThread_*>.d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> +
         -1);
    UNLOCK();
    if ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0)
    {
      QArrayData::deallocate
                (&((this->waitingThreads).super_QList<QThreadPoolThread_*>.d.d)->super_QArrayData,8,
                 0x10);
    }
  }
  QHash<QThreadPoolThread_*,_QHashDummyValue>::~QHash(&(this->allThreads).q_hash);
  QMutex::~QMutex(&this->mutex);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

class Q_CORE_EXPORT QThreadPoolPrivate : public QObjectPrivate
{
    Q_DECLARE_PUBLIC(QThreadPool)
    friend class QThreadPoolThread;

public:
    QThreadPoolPrivate();

    bool tryStart(QRunnable *task);
    void enqueueTask(QRunnable *task, int priority = 0);
    int activeThreadCount() const;

    void tryToStartMoreThreads();
    bool areAllThreadsActive() const;
    bool tooManyThreadsActive() const;

    int maxThreadCount() const
    { return qMax(requestedMaxThreadCount, 1); }    // documentation says we start at least one
    void startThread(QRunnable *runnable = nullptr);
    void reset();
    bool waitForDone(const QDeadlineTimer &timer);
    void clear();
    void stealAndRunRunnable(QRunnable *runnable);
    void deletePageIfFinished(QueuePage *page);

    mutable QMutex mutex;
    QSet<QThreadPoolThread *> allThreads;
    QQueue<QThreadPoolThread *> waitingThreads;
    QQueue<QThreadPoolThread *> expiredThreads;
    QList<QueuePage *> queue;
    QWaitCondition noActiveThreads;
    QString objectName;

    std::chrono::duration<int, std::milli> expiryTimeout = std::chrono::seconds(30);
    int requestedMaxThreadCount = QThread::idealThreadCount();  // don't use this directly
    int reservedThreads = 0;
    int activeThreads = 0;
    uint stackSize = 0;
    QThread::Priority threadPriority = QThread::InheritPriority;
    QThread::QualityOfService serviceLevel = QThread::QualityOfService::Auto;
}